

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Clara::CommandLine<Catch::ConfigData>::optUsage
          (CommandLine<Catch::ConfigData> *this,ostream *os,size_t indent,size_t width)

{
  ulong uVar1;
  bool bVar2;
  const_iterator cVar3;
  TextAttributes *pTVar4;
  pointer pAVar5;
  unsigned_long *puVar6;
  size_t sVar7;
  string *psVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ostream *poVar12;
  allocator local_1f1;
  string local_1f0 [38];
  byte local_1ca;
  allocator local_1c9;
  string local_1c8 [8];
  string usageCol;
  size_t local_1a8;
  size_t local_1a0;
  ulong local_198;
  size_t i;
  undefined1 local_170 [8];
  Text desc;
  TextAttributes local_108;
  undefined1 local_e8 [40];
  Text usage;
  unsigned_long local_50;
  unsigned_long local_48;
  size_t maxWidth;
  const_iterator it;
  const_iterator itEnd;
  const_iterator itBegin;
  size_t width_local;
  size_t indent_local;
  ostream *os_local;
  CommandLine<Catch::ConfigData> *this_local;
  
  cVar3 = std::
          vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>
          ::begin(&this->m_options);
  it = std::
       vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>
       ::end(&this->m_options);
  __gnu_cxx::
  __normal_iterator<const_Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
  ::__normal_iterator((__normal_iterator<const_Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
                       *)&maxWidth);
  local_48 = 0;
  maxWidth = (size_t)cVar3;
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
                             *)&maxWidth,&it), bVar2) {
    __gnu_cxx::
    __normal_iterator<const_Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
    ::operator->((__normal_iterator<const_Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
                  *)&maxWidth);
    Arg::commands_abi_cxx11_
              ((Arg *)&usage.lines.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_50 = std::__cxx11::string::size();
    puVar6 = std::max<unsigned_long>(&local_48,&local_50);
    local_48 = *puVar6;
    std::__cxx11::string::~string
              ((string *)
               &usage.lines.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<const_Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
    ::operator++((__normal_iterator<const_Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
                  *)&maxWidth);
  }
  while (maxWidth = (size_t)cVar3._M_current,
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
                            *)&maxWidth,&it), bVar2) {
    __gnu_cxx::
    __normal_iterator<const_Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
    ::operator->((__normal_iterator<const_Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
                  *)&maxWidth);
    Arg::commands_abi_cxx11_((Arg *)local_e8);
    Catch::TextAttributes::TextAttributes(&local_108);
    pTVar4 = Catch::TextAttributes::setWidth(&local_108,local_48 + indent);
    pTVar4 = Catch::TextAttributes::setIndent(pTVar4,indent);
    Catch::Text::Text((Text *)(local_e8 + 0x20),(string *)local_e8,pTVar4);
    std::__cxx11::string::~string((string *)local_e8);
    pAVar5 = __gnu_cxx::
             __normal_iterator<const_Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
             ::operator->((__normal_iterator<const_Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
                           *)&maxWidth);
    Catch::TextAttributes::TextAttributes((TextAttributes *)&i);
    pTVar4 = Catch::TextAttributes::setWidth((TextAttributes *)&i,(width - local_48) - 3);
    Catch::Text::Text((Text *)local_170,&pAVar5->description,pTVar4);
    local_198 = 0;
    while( true ) {
      uVar9 = local_198;
      local_1a0 = Catch::Text::size((Text *)(local_e8 + 0x20));
      local_1a8 = Catch::Text::size((Text *)local_170);
      puVar6 = std::max<unsigned_long>(&local_1a0,&local_1a8);
      uVar1 = local_198;
      if (*puVar6 <= uVar9) break;
      local_1ca = 0;
      sVar7 = Catch::Text::size((Text *)(local_e8 + 0x20));
      if (uVar1 < sVar7) {
        psVar8 = Catch::Text::operator[][abi_cxx11_((Text *)(local_e8 + 0x20),local_198);
        std::__cxx11::string::string(local_1c8,(string *)psVar8);
      }
      else {
        std::allocator<char>::allocator();
        local_1ca = 1;
        std::__cxx11::string::string(local_1c8,"",&local_1c9);
      }
      if ((local_1ca & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
      }
      std::operator<<(os,local_1c8);
      uVar9 = local_198;
      sVar7 = Catch::Text::size((Text *)local_170);
      if (uVar9 < sVar7) {
        Catch::Text::operator[][abi_cxx11_((Text *)local_170,local_198);
        uVar9 = std::__cxx11::string::empty();
        if ((uVar9 & 1) == 0) {
          lVar10 = indent + local_48;
          lVar11 = std::__cxx11::string::size();
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1f0,(lVar10 - lVar11) + 2,' ',&local_1f1);
          poVar12 = std::operator<<(os,local_1f0);
          psVar8 = Catch::Text::operator[][abi_cxx11_((Text *)local_170,local_198);
          std::operator<<(poVar12,(string *)psVar8);
          std::__cxx11::string::~string(local_1f0);
          std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
        }
      }
      std::operator<<(os,"\n");
      std::__cxx11::string::~string(local_1c8);
      local_198 = local_198 + 1;
    }
    Catch::Text::~Text((Text *)local_170);
    Catch::Text::~Text((Text *)(local_e8 + 0x20));
    __gnu_cxx::
    __normal_iterator<const_Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
    ::operator++((__normal_iterator<const_Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
                  *)&maxWidth);
    cVar3._M_current = (Arg *)maxWidth;
  }
  return;
}

Assistant:

void optUsage( std::ostream& os, std::size_t indent = 0, std::size_t width = CATCH_CONFIG_CONSOLE_WIDTH ) const {
            typename std::vector<Arg>::const_iterator itBegin = m_options.begin(), itEnd = m_options.end(), it;
            std::size_t maxWidth = 0;
            for( it = itBegin; it != itEnd; ++it )
                maxWidth = (std::max)( maxWidth, it->commands().size() );

            for( it = itBegin; it != itEnd; ++it ) {
                Catch::Text usage( it->commands(), Catch::TextAttributes()
                                                        .setWidth( maxWidth+indent )
                                                        .setIndent( indent ) );
                // !TBD handle longer usage strings
                Catch::Text desc( it->description, Catch::TextAttributes()
                                                        .setWidth( width - maxWidth -3 ) );

                for( std::size_t i = 0; i < (std::max)( usage.size(), desc.size() ); ++i ) {
                    std::string usageCol = i < usage.size() ? usage[i] : "";
                    os << usageCol;

                    if( i < desc.size() && !desc[i].empty() )
                        os  << std::string( indent + 2 + maxWidth - usageCol.size(), ' ' )
                            << desc[i];
                    os << "\n";
                }
            }
        }